

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall inja::ParserError::~ParserError(ParserError *this)

{
  ParserError *this_local;
  
  ~ParserError(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit ParserError(const std::string& message, SourceLocation location): InjaError("parser_error", message, location) {}